

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::erase_selected_element(Mesh *this)

{
  HalfedgeElement *this_00;
  Vertex *this_01;
  HalfedgeIter *pHVar1;
  pointer pHVar2;
  EdgeIter *pEVar3;
  VertexIter *pVVar4;
  Face *pFVar5;
  _List_iterator<CMU462::Face> local_30;
  FaceIter f;
  Edge *edge;
  Vertex *vertex;
  HalfedgeElement *element;
  Mesh *this_local;
  
  if (((this->super_SceneObject).scene != (Scene *)0x0) &&
     (this_00 = (((this->super_SceneObject).scene)->selected).element,
     this_00 != (HalfedgeElement *)0x0)) {
    this_01 = HalfedgeElement::getVertex(this_00);
    f._M_node = (_List_node_base *)HalfedgeElement::getEdge(this_00);
    std::_List_iterator<CMU462::Face>::_List_iterator(&local_30);
    if (f._M_node == (_List_node_base *)0x0) {
      if (this_01 == (Vertex *)0x0) {
        return;
      }
      pHVar1 = Vertex::halfedge(this_01);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar1);
      pVVar4 = Halfedge::vertex(pHVar2);
      local_30._M_node = (_List_node_base *)HalfedgeMesh::eraseVertex(&this->mesh,pVVar4->_M_node);
    }
    else {
      pHVar1 = Edge::halfedge((Edge *)f._M_node);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar1);
      pEVar3 = Halfedge::edge(pHVar2);
      local_30._M_node = (_List_node_base *)HalfedgeMesh::eraseEdge(&this->mesh,pEVar3->_M_node);
    }
    Selection::clear(&((this->super_SceneObject).scene)->selected);
    (((this->super_SceneObject).scene)->selected).object = &this->super_SceneObject;
    pFVar5 = elementAddress((FaceIter)local_30._M_node);
    (((this->super_SceneObject).scene)->selected).element = &pFVar5->super_HalfedgeElement;
    Selection::clear(&((this->super_SceneObject).scene)->hovered);
    Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
  }
  return;
}

Assistant:

void Mesh::erase_selected_element() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Vertex* vertex = element->getVertex();
   Edge* edge = element->getEdge();
   FaceIter f;
   if (edge != nullptr)
   {
      f = mesh.eraseEdge(edge->halfedge()->edge());
   }
   else if( vertex != nullptr )
   {
      f = mesh.eraseVertex(vertex->halfedge()->vertex());
   }
   else
   {
      return;
   }
   scene->selected.clear();
   scene->selected.object = this;
   scene->selected.element = elementAddress( f );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}